

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O1

int __thiscall CDesign::Initialize(CDesign *this,char *pName)

{
  undefined1 *__filename;
  undefined1 *__filename_00;
  Branch *pBVar1;
  CNet *pCVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  FILE *pFVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  CLayer *this_00;
  CNet *pCVar17;
  CPin *pCVar18;
  ulong uVar19;
  CWire *pCVar20;
  CPin *pCVar21;
  undefined4 extraout_var;
  CLayer *pCVar22;
  CBoundary *this_01;
  int iVar23;
  int iVar24;
  int *piVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  Branch *pBVar30;
  int j;
  long lVar31;
  uint uVar32;
  uint uVar33;
  Branch *pBVar34;
  long lVar35;
  ulong uVar36;
  bool bVar37;
  Tree TVar38;
  FILE *local_6b0;
  int local_684;
  vector<CPin_*,_std::allocator<CPin_*>_> PinList;
  CPin *pPin;
  int local_64c;
  undefined1 *local_648;
  long local_640;
  char cLine [512];
  char cNetName [512];
  char cName [512];
  
  ReadParam(this,pName);
  if (CObject::m_pLog != (FILE *)0x0) {
    fclose((FILE *)CObject::m_pLog);
    CObject::m_pLog = (FILE *)0x0;
  }
  __filename = &this->field_0x234;
  sprintf(cName,"%s.log",__filename);
  CObject::m_pLog = (FILE *)fopen(cName,"wt");
  CObject::m_pDesign = this;
  CObject::Display(0,"input file [%s]\n",__filename);
  __filename_00 = &this->field_0x434;
  CObject::Display(0,"tree file [%s]\n",__filename_00);
  local_648 = __filename;
  pFVar13 = fopen(__filename,"rt");
  local_6b0 = fopen(__filename_00,"rt");
  if (local_6b0 == (FILE *)0x0) {
    CObject::Display(0,"tree file will be written as ");
    if (*__filename_00 == '\0') {
      sprintf(__filename_00,"%s.stt",local_648);
    }
    CObject::Display(5,"%s",__filename_00);
    local_6b0 = fopen(__filename_00,"wt");
    readLUT();
    CObject::Display(0,"building steiner tree by *pure flute\n");
  }
  else {
    this->IsLUTup = 1;
  }
  pcVar14 = fgets(cLine,0x200,pFVar13);
  if (pcVar14 != (char *)0x0) {
LAB_00105d05:
    if ((cLine[0] == '#') || (sVar15 = strlen(cLine), sVar15 < 2)) goto LAB_00105fe3;
    pcVar14 = strtok(cLine," \t\n");
    iVar3 = strcasecmp(pcVar14,"grid");
    if (iVar3 == 0) {
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar14);
      this->m_iSizeX = iVar3;
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar14);
      this->m_iSizeY = iVar3;
      pcVar14 = strtok((char *)0x0," \t\n");
      if (pcVar14 == (char *)0x0) {
        this->m_iSizeZ = 2;
      }
      else {
        iVar3 = atoi(pcVar14);
        if (iVar3 < 3) {
          iVar3 = 2;
        }
        this->m_iSizeZ = iVar3;
      }
      CBBox::Initialize(&this->super_CBBox,0,0,0,this->m_iSizeX,this->m_iSizeY,this->m_iSizeZ);
      CreateLayer(this);
      goto LAB_00105fe3;
    }
    iVar3 = strcasecmp(pcVar14,"vertical");
    if ((iVar3 == 0) && (pcVar16 = strtok((char *)0x0," \t\n"), pcVar16 != (char *)0x0)) {
      pcVar14 = strtok((char *)0x0," \t\n");
      if (pcVar14 != (char *)0x0) {
        iVar3 = 1;
        do {
          iVar12 = atoi(pcVar14);
          iVar6 = iVar3;
          if (iVar12 != 0) {
            do {
              iVar3 = iVar6;
              pCVar22 = GetLayer(this,iVar3);
              iVar6 = iVar3 + 1;
            } while ((pCVar22->super_CObject).m_Key != 0);
            pCVar22 = GetLayer(this,iVar3);
            CLayer::Configure(pCVar22,iVar3,iVar12,10,0,0,0,this);
          }
          iVar3 = iVar3 + 1;
          pcVar14 = strtok((char *)0x0," \t\n");
        } while (pcVar14 != (char *)0x0);
      }
      goto LAB_00105fe3;
    }
    iVar3 = strcasecmp(pcVar14,"horizontal");
    if ((iVar3 == 0) && (pcVar16 = strtok((char *)0x0," \t\n"), pcVar16 != (char *)0x0)) {
      pcVar14 = strtok((char *)0x0," \t\n");
      if (pcVar14 != (char *)0x0) {
        iVar3 = 1;
        do {
          iVar12 = atoi(pcVar14);
          iVar6 = iVar3;
          if (iVar12 != 0) {
            do {
              iVar3 = iVar6;
              pCVar22 = GetLayer(this,iVar3);
              iVar6 = iVar3 + 1;
            } while ((pCVar22->super_CObject).m_Key != 0);
            pCVar22 = GetLayer(this,iVar3);
            CLayer::Configure(pCVar22,iVar3,iVar12,5,0,0,0,this);
          }
          iVar3 = iVar3 + 1;
          pcVar14 = strtok((char *)0x0," \t\n");
        } while (pcVar14 != (char *)0x0);
      }
      goto LAB_00105fe3;
    }
    iVar3 = strcasecmp(pcVar14,"minimum");
    if (iVar3 == 0) {
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = strcasecmp(pcVar14,"width");
      if (iVar3 == 0) {
        pcVar14 = strtok((char *)0x0," \t\n");
        if (pcVar14 != (char *)0x0) {
          iVar3 = 1;
          do {
            pCVar22 = GetLayer(this,iVar3);
            iVar6 = atoi(pcVar14);
            CLayer::Configure(pCVar22,-1,-1,-1,iVar6,-1,-1,this);
            pcVar14 = strtok((char *)0x0," \t\n");
            iVar3 = iVar3 + 1;
          } while (pcVar14 != (char *)0x0);
        }
      }
      else {
        iVar3 = strcasecmp(pcVar14,"spacing");
        if ((iVar3 == 0) && (pcVar14 = strtok((char *)0x0," \t\n"), pcVar14 != (char *)0x0)) {
          iVar3 = 1;
          do {
            pCVar22 = GetLayer(this,iVar3);
            iVar6 = atoi(pcVar14);
            CLayer::Configure(pCVar22,-1,-1,-1,-1,iVar6,-1,this);
            pcVar14 = strtok((char *)0x0," \t\n");
            iVar3 = iVar3 + 1;
          } while (pcVar14 != (char *)0x0);
        }
      }
      goto LAB_00105fe3;
    }
    iVar3 = strcasecmp(pcVar14,"via");
    if (iVar3 == 0) {
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = strcasecmp(pcVar14,"spacing");
      if ((iVar3 == 0) && (pcVar14 = strtok((char *)0x0," \t\n"), pcVar14 != (char *)0x0)) {
        iVar3 = 1;
        do {
          pCVar22 = GetLayer(this,iVar3);
          iVar6 = atoi(pcVar14);
          CLayer::Configure(pCVar22,-1,-1,-1,-1,-1,iVar6,this);
          pcVar14 = strtok((char *)0x0," \t\n");
          iVar3 = iVar3 + 1;
        } while (pcVar14 != (char *)0x0);
      }
      goto LAB_00105fe3;
    }
    iVar3 = strcasecmp(pcVar14,"num");
    if (iVar3 != 0) {
      iVar3 = atoi(pcVar14);
      this->m_iLowX = iVar3;
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar14);
      this->m_iLowY = iVar3;
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar14);
      this->m_iGridX = iVar3;
      pcVar14 = strtok((char *)0x0," \t\n");
      iVar3 = atoi(pcVar14);
      this->m_iGridY = iVar3;
      goto LAB_00105fe3;
    }
    pcVar14 = strtok((char *)0x0," \t\n");
    iVar3 = strcasecmp(pcVar14,"net");
    if (iVar3 != 0) goto LAB_00105fe3;
    pcVar14 = strtok((char *)0x0," \t\n");
    iVar3 = atoi(pcVar14);
    CreateNet(this,iVar3);
    iVar6 = (int)(this->super_CBBox).m_cMaxZ;
    iVar8 = (int)(this->super_CBBox).m_cMinZ;
    iVar12 = iVar6 - iVar8;
    iVar3 = 0;
    if (iVar12 != 0 && iVar8 <= iVar6) {
      do {
        iVar6 = iVar3 + 1;
        pCVar22 = GetLayer(this,iVar6);
        if ((pCVar22->super_CObject).m_Key == 0) {
          if (iVar3 == 0) {
            iVar3 = 10;
          }
          else {
            this_00 = GetLayer(this,iVar3);
            iVar3 = CLayer::GetDirection(this_00);
            iVar3 = (uint)(iVar3 != 10) * 5 + 5;
          }
          CLayer::Configure(pCVar22,iVar6,0,iVar3,0,0,0,this);
        }
        (*(pCVar22->super_CObject)._vptr_CObject[3])(pCVar22);
        iVar3 = this->m_iMaxCapacity;
        iVar12 = CLayer::GetCapacity(pCVar22,0x40);
        if (iVar12 < iVar3) {
          iVar3 = this->m_iMaxCapacity;
        }
        else {
          iVar3 = CLayer::GetCapacity(pCVar22,0x40);
        }
        this->m_iMaxCapacity = iVar3;
        iVar12 = (int)(this->super_CBBox).m_cMaxZ - (int)(this->super_CBBox).m_cMinZ;
        iVar3 = iVar6;
      } while (iVar6 < iVar12);
    }
    this->m_iHighestRoutableLayer = iVar12;
    this->m_iLowestRoutableLayer = 1;
  }
LAB_001062e3:
  uVar4 = GetCapacity(this,0x1000);
  local_684 = 0;
  CObject::Display(0,"total available capacity: %d\n",(ulong)uVar4);
  iVar3 = GetMemory();
  CObject::Display(0,"reading nets started (%.1f MB)\n",SUB84((double)iVar3 * 0.0009765625,0));
  if (0 < this->m_iNumNet) {
    local_684 = 0;
    iVar3 = 0;
    do {
      local_64c = iVar3;
      do {
        pcVar14 = fgets(cLine,0x200,pFVar13);
        if (pcVar14 == (char *)0x0) break;
      } while ((cLine[0] == '#') || (sVar15 = strlen(cLine), sVar15 < 2));
      pcVar14 = strtok(cLine," \t\n");
      sprintf(cNetName,pcVar14);
      pcVar14 = strtok((char *)0x0," \t\n");
      uVar4 = atoi(pcVar14);
      pcVar14 = strtok((char *)0x0," \t\n");
      uVar5 = atoi(pcVar14);
      strtok((char *)0x0," \t\n");
      pCVar17 = (CNet *)operator_new(0x68);
      CNet::CNet(pCVar17);
      local_640 = (long)local_684;
      this->m_ppNet[local_640] = pCVar17;
      pCVar17 = this->m_ppNet[local_640];
      if (pCVar17 == (CNet *)0x0) {
        __assert_fail("m_ppNet[iNetIndex]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                      ,0x30c,"virtual int CDesign::Initialize(char *)");
      }
      (*(pCVar17->super_CObject)._vptr_CObject[3])(pCVar17,(ulong)uVar4);
      if (1000 < (int)uVar5) {
        uVar4 = 0;
        CObject::Display(3,"net (%s) with too many pins (%d) will be ignored\n",cNetName,
                         (ulong)uVar5);
LAB_00106452:
        do {
          pcVar14 = fgets(cLine,0x200,pFVar13);
          if (pcVar14 != (char *)0x0) {
            if ((cLine[0] == '#') || (sVar15 = strlen(cLine), sVar15 < 2)) goto LAB_00106452;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar5);
        uVar5 = 0;
      }
      PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (0 < (int)uVar5) {
        uVar4 = 0;
LAB_001064ad:
        do {
          pcVar14 = fgets(cLine,0x200,pFVar13);
          if (pcVar14 != (char *)0x0) {
            if ((cLine[0] == '#') || (sVar15 = strlen(cLine), sVar15 < 2)) goto LAB_001064ad;
          }
          pcVar14 = strtok(cLine," \t\n");
          iVar3 = atoi(pcVar14);
          pcVar14 = strtok((char *)0x0," \t\n");
          iVar6 = atoi(pcVar14);
          uVar36 = (long)(iVar3 - this->m_iLowX) / (long)this->m_iGridX;
          uVar19 = (long)(iVar6 - this->m_iLowY) / (long)this->m_iGridY;
          pcVar14 = strtok((char *)0x0," \t\n");
          if (pcVar14 == (char *)0x0) {
            uVar7 = 1;
          }
          else {
            uVar7 = atoi(pcVar14);
          }
          pPin = (CPin *)0x0;
          bVar37 = true;
          if ((long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            uVar29 = 1;
            pCVar18 = (CPin *)0x0;
            do {
              pCVar21 = PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar29 - 1];
              if (((int)uVar36 == (int)(pCVar21->super_CPoint).m_iX) &&
                 ((int)uVar19 == (int)(pCVar21->super_CPoint).m_iY)) {
                pCVar18 = pCVar21;
                pPin = pCVar21;
              }
              bVar37 = pCVar18 == (CPin *)0x0;
            } while ((uVar29 < (ulong)((long)PinList.
                                             super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)PinList.
                                             super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 3)) &&
                    (uVar29 = uVar29 + 1, pCVar18 == (CPin *)0x0));
          }
          if (bVar37) {
            pCVar18 = (CPin *)operator_new(0x28);
            CPin::CPin(pCVar18);
            pPin = pCVar18;
            (*(pCVar18->super_CPoint).super_CObject._vptr_CObject[4])
                      (pCVar18,(ulong)((long)PinList.
                                             super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)PinList.
                                            super__Vector_base<CPin_*,_std::allocator<CPin_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3,
                       uVar36 & 0xffffffff,uVar19 & 0xffffffff,(ulong)uVar7);
            if (PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<CPin*,std::allocator<CPin*>>::_M_realloc_insert<CPin*const&>
                        ((vector<CPin*,std::allocator<CPin*>> *)&PinList,
                         (iterator)
                         PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&pPin);
            }
            else {
              *PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
               super__Vector_impl_data._M_finish = pPin;
              PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar5);
      }
      CNet::AddPin(pCVar17,&PinList);
      if (this->IsLUTup == 0) {
        pcVar14 = fgets(cLine,0x200,local_6b0);
        if (cLine[0] != '!' && pcVar14 != (char *)0x0) {
          do {
            if ((cLine[0] != '#') && (sVar15 = strlen(cLine), 1 < sVar15)) {
              strtok(cLine," \t\n");
              strtok((char *)0x0," \t\n");
              pcVar14 = strtok((char *)0x0," \t\n");
              iVar3 = atoi(pcVar14);
              if (0 < iVar3) {
                iVar6 = 0;
LAB_00106716:
                do {
                  pcVar14 = fgets(cLine,0x200,local_6b0);
                  if (pcVar14 != (char *)0x0) {
                    if ((cLine[0] == '#') || (sVar15 = strlen(cLine), sVar15 < 2))
                    goto LAB_00106716;
                  }
                  iVar12 = CNet::GetNumPin(pCVar17);
                  if (1 < iVar12) {
                    pCVar20 = CWire::New();
                    if (pCVar20 == (CWire *)0x0) {
                      __assert_fail("pWire",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                                    ,0x3a7,"virtual int CDesign::Initialize(char *)");
                    }
                    pcVar14 = strtok(cLine," \t\n");
                    iVar12 = atoi(pcVar14);
                    pcVar14 = strtok((char *)0x0," \t\n");
                    iVar8 = atoi(pcVar14);
                    strtok((char *)0x0," \t\n");
                    pcVar14 = strtok((char *)0x0," \t\n");
                    iVar24 = atoi(pcVar14);
                    pcVar14 = strtok((char *)0x0," \t\n");
                    iVar27 = atoi(pcVar14);
                    pCVar18 = CNet::GetPin(pCVar17,iVar12,iVar8);
                    pCVar21 = CNet::GetPin(pCVar17,iVar24,iVar27);
                    if (pCVar18 == (CPin *)0x0) {
                      iVar23 = this->m_iLowestRoutableLayer;
                    }
                    else {
                      iVar23 = (int)(pCVar18->super_CPoint).m_cZ;
                    }
                    if (pCVar21 == (CPin *)0x0) {
                      iVar26 = this->m_iLowestRoutableLayer;
                    }
                    else {
                      iVar26 = (int)(pCVar21->super_CPoint).m_cZ;
                    }
                    if (iVar26 < iVar23) {
                      if (pCVar18 == (CPin *)0x0) {
LAB_0010684f:
                        iVar23 = this->m_iLowestRoutableLayer;
                      }
                      else {
                        iVar23 = (int)(pCVar18->super_CPoint).m_cZ;
                      }
                    }
                    else {
                      if (pCVar21 == (CPin *)0x0) goto LAB_0010684f;
                      iVar23 = (int)(pCVar21->super_CPoint).m_cZ;
                    }
                    CWire::Initialize(pCVar20,iVar12,iVar8,iVar24,iVar27,iVar23);
                    CNet::AddWire(pCVar17,pCVar20);
                  }
                  iVar6 = iVar6 + 1;
                } while (iVar6 != iVar3);
              }
            }
            pcVar14 = fgets(cLine,0x200,local_6b0);
          } while ((pcVar14 != (char *)0x0) && (cLine[0] != '!'));
        }
      }
      else {
        iVar3 = CNet::GetNumPin(pCVar17);
        if (iVar3 < 2) {
          if (local_6b0 != (FILE *)0x0) {
            fprintf(local_6b0,"%s %d %d\n!\n",cNetName,(ulong)(uint)(pCVar17->super_CObject).m_Key,0
                   );
          }
        }
        else {
          lVar35 = 0;
          for (lVar31 = 0; iVar3 = CNet::GetNumPin(pCVar17), lVar31 < iVar3; lVar31 = lVar31 + 1) {
            pCVar18 = CNet::GetPin(pCVar17,(int)lVar31);
            *(int *)((long)Initialize::iArrX + lVar35) = (int)(pCVar18->super_CPoint).m_iX;
            pCVar18 = CNet::GetPin(pCVar17,(int)lVar31);
            *(int *)((long)Initialize::iArrY + lVar35) = (int)(pCVar18->super_CPoint).m_iY;
            lVar35 = lVar35 + 4;
          }
          iVar3 = CNet::GetNumPin(pCVar17);
          if (iVar3 < 10) {
            iVar3 = CNet::GetNumPin(pCVar17);
            TVar38 = flute(iVar3,Initialize::iArrX,Initialize::iArrY,3);
          }
          else {
            iVar3 = CNet::GetNumPin(pCVar17);
            TVar38 = flute(iVar3,Initialize::iArrX,Initialize::iArrY,0x1c);
          }
          pBVar30 = TVar38.branch;
          iVar3 = TVar38.deg;
          uVar4 = iVar3 * 2 - 2;
          uVar36 = 0;
          if (1 < iVar3) {
            uVar19 = 1;
            if (1 < (int)uVar4) {
              uVar19 = (ulong)uVar4;
            }
            piVar25 = &pBVar30->n;
            uVar29 = 0;
            uVar36 = 0;
            do {
              uVar5 = *piVar25;
              if ((uVar29 != uVar5) &&
                 ((((Branch *)(piVar25 + -2))->x != pBVar30[(int)uVar5].x ||
                  (piVar25[-1] != pBVar30[(int)uVar5].y)))) {
                uVar36 = (ulong)((int)uVar36 + 1);
              }
              uVar29 = uVar29 + 1;
              piVar25 = piVar25 + 3;
            } while (uVar19 != uVar29);
          }
          if (local_6b0 != (FILE *)0x0) {
            fprintf(local_6b0,"%s %d %d\n",cNetName,(ulong)(uint)(pCVar17->super_CObject).m_Key,
                    uVar36);
          }
          if (1 < iVar3) {
            if ((int)uVar4 < 2) {
              uVar4 = 1;
            }
            uVar36 = 0;
            pBVar34 = pBVar30;
            do {
              uVar5 = pBVar34->n;
              if (uVar36 != uVar5) {
                pBVar1 = pBVar30 + (int)uVar5;
                if ((pBVar34->x != pBVar30[(int)uVar5].x) || (pBVar34->y != pBVar1->y)) {
                  if (local_6b0 != (FILE *)0x0) {
                    fprintf(local_6b0,"%d %d - %d %d\n",(ulong)(uint)pBVar34->x,
                            (ulong)(uint)pBVar34->y,(ulong)(uint)pBVar30[(int)uVar5].x,
                            (ulong)(uint)pBVar1->y);
                  }
                  pCVar20 = CWire::New();
                  if (pCVar20 == (CWire *)0x0) {
                    __assert_fail("pWire",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                                  ,0x37b,"virtual int CDesign::Initialize(char *)");
                  }
                  iVar3 = pBVar34->x;
                  iVar6 = pBVar34->y;
                  iVar12 = pBVar1->x;
                  iVar8 = pBVar1->y;
                  pCVar21 = CNet::GetPin(pCVar17,iVar3,iVar6);
                  pCVar18 = CNet::GetPin(pCVar17,iVar12,iVar8);
                  if (pCVar21 == (CPin *)0x0) {
                    iVar24 = this->m_iLowestRoutableLayer;
                  }
                  else {
                    iVar24 = (int)(pCVar21->super_CPoint).m_cZ;
                  }
                  if (pCVar18 == (CPin *)0x0) {
                    iVar27 = this->m_iLowestRoutableLayer;
                  }
                  else {
                    iVar27 = (int)(pCVar18->super_CPoint).m_cZ;
                  }
                  if (iVar27 < iVar24) {
                    pCVar18 = pCVar21;
                  }
                  if (pCVar18 == (CPin *)0x0) {
                    iVar24 = this->m_iLowestRoutableLayer;
                  }
                  else {
                    iVar24 = (int)(pCVar18->super_CPoint).m_cZ;
                  }
                  CWire::Initialize(pCVar20,iVar3,iVar6,iVar12,iVar8,iVar24);
                  CNet::AddWire(pCVar17,pCVar20);
                }
              }
              uVar36 = uVar36 + 1;
              pBVar34 = pBVar34 + 1;
            } while (uVar4 != uVar36);
          }
          if (local_6b0 != (FILE *)0x0) {
            fwrite("!\n",2,1,local_6b0);
          }
          fflush(local_6b0);
        }
      }
      iVar3 = CNet::IsLocal(pCVar17);
      if (iVar3 == 0) {
        iVar3 = CNet::GetNumWire(pCVar17,1,3);
        if (iVar3 == 0) {
          CObject::Display(1,"net %s should have at least one wire\n",cNetName);
        }
        iVar3 = CNet::GetLength(pCVar17,1,2);
        pCVar17->m_iMinWL = iVar3;
        local_684 = local_684 + 1;
      }
      else {
        pCVar2 = this->m_ppNet[local_640];
        if (pCVar17 != pCVar2) {
          __assert_fail("pNet==m_ppNet[iNetIndex]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                        ,0x3bd,"virtual int CDesign::Initialize(char *)");
        }
        if (pCVar2 != (CNet *)0x0) {
          (*(pCVar2->super_CObject)._vptr_CObject[1])();
          this->m_ppNet[local_640] = (CNet *)0x0;
        }
        this->m_iNumLocalNet = this->m_iNumLocalNet + 1;
      }
      iVar3 = local_64c;
      if (PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)PinList.super__Vector_base<CPin_*,_std::allocator<CPin_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->m_iNumNet);
  }
  CreateNet(this,local_684);
  pcVar14 = fgets(cLine,0x200,pFVar13);
  if (pcVar14 != (char *)0x0) {
    do {
      if ((cLine[0] != '#') && (sVar15 = strlen(cLine), 1 < sVar15)) {
        uVar4 = atoi(cLine);
        if (uVar4 != 0) {
          CObject::Display(0,"%d blocakges are specified\n",(ulong)uVar4);
          if ((int)uVar4 < 1) goto LAB_00106f97;
          uVar5 = 0;
          goto LAB_00106cfc;
        }
        break;
      }
      pcVar14 = fgets(cLine,0x200,pFVar13);
    } while (pcVar14 != (char *)0x0);
  }
  goto LAB_00106fbb;
LAB_00105fe3:
  pcVar14 = fgets(cLine,0x200,pFVar13);
  if (pcVar14 == (char *)0x0) goto LAB_001062e3;
  goto LAB_00105d05;
LAB_00106cfc:
  do {
    do {
      pcVar14 = fgets(cLine,0x200,pFVar13);
      if (pcVar14 == (char *)0x0) break;
    } while ((cLine[0] == '#') || (sVar15 = strlen(cLine), sVar15 < 2));
    pcVar14 = strtok(cLine," \t\n");
    uVar7 = atoi(pcVar14);
    pcVar14 = strtok((char *)0x0," \t\n");
    uVar9 = atoi(pcVar14);
    pcVar14 = strtok((char *)0x0," \t\n");
    iVar3 = atoi(pcVar14);
    pcVar14 = strtok((char *)0x0," \t\n");
    uVar10 = atoi(pcVar14);
    pcVar14 = strtok((char *)0x0," \t\n");
    uVar11 = atoi(pcVar14);
    pcVar14 = strtok((char *)0x0," \t\n");
    iVar6 = atoi(pcVar14);
    if (iVar3 != iVar6) {
      __assert_fail("iZ1==iZ2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x3f0,"virtual int CDesign::Initialize(char *)");
    }
    if (uVar9 - uVar11 != 0 && uVar7 - uVar10 != 0) {
      __assert_fail("iX1==iX2||iY1==iY2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x3f1,"virtual int CDesign::Initialize(char *)");
    }
    uVar33 = (uVar7 - uVar10) + 1;
    if (((uVar33 & 0xfffffffd) != 0) && (((uVar9 - uVar11) + 1 & 0xfffffffd) != 0)) {
      __assert_fail("abs((iX1-iX2))==1||abs((iY1-iY2))==1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x3f2,"virtual int CDesign::Initialize(char *)");
    }
    pCVar22 = GetLayer(this,iVar3);
    if (uVar7 == uVar10 && uVar9 == uVar11) {
      this_01 = (CBoundary *)0x0;
    }
    else {
      iVar12 = CLayer::IsHorizontal(pCVar22);
      uVar28 = uVar9;
      uVar32 = uVar7;
      if ((uVar9 - uVar11 == 0) && (iVar12 != 0)) {
        if ((uVar33 & 0xfffffffd) != 0) {
          __assert_fail("abs(iX1-iX2)==1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                        ,0xaf,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
        }
        if ((int)uVar10 <= (int)uVar7) {
          uVar32 = uVar10;
        }
LAB_00106eb9:
        this_01 = CLayer::GetBoundary(pCVar22,uVar32,uVar28);
      }
      else {
        iVar12 = CLayer::IsVertical(pCVar22);
        if (uVar7 == uVar10) {
          this_01 = (CBoundary *)0x0;
          if (iVar12 != 0) {
            if (((uVar9 - uVar11) + 1 & 0xfffffffd) != 0) {
              __assert_fail("abs(iY1-iY2)==1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Layer.h"
                            ,0xb4,"CBoundary *CLayer::GetBoundary(int, int, int, int)");
            }
            if ((int)uVar11 <= (int)uVar9) {
              uVar28 = uVar11;
            }
            goto LAB_00106eb9;
          }
        }
        else {
          this_01 = (CBoundary *)0x0;
        }
      }
    }
    if (this_01 == (CBoundary *)0x0) {
      CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",(ulong)uVar7,(ulong)uVar9,
                       iVar3,uVar10,(ulong)uVar11,CONCAT44(extraout_var,iVar6));
    }
    if (*(short *)&(this_01->super_CPoint).field_0x26 != 0) {
      CObject::Display(1,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",(ulong)uVar7,(ulong)uVar9
                       ,iVar3,uVar10,(ulong)uVar11,CONCAT44(extraout_var,iVar6));
    }
    pCVar22 = CBoundary::GetParent(this_01);
    iVar3 = CLayer::GetCapacity(pCVar22,0x40);
    pcVar14 = strtok((char *)0x0," \t\n");
    iVar6 = atoi(pcVar14);
    this->m_iNumBCap = this->m_iNumBCap + (iVar3 - iVar6);
    CBoundary::AdjustCapacity(this_01,iVar3 - iVar6);
    uVar5 = uVar5 + 1;
  } while (uVar5 != uVar4);
LAB_00106f97:
  uVar4 = GetCapacity(this,0x1000);
  CObject::Display(0,"total available capacity: %d\n",(ulong)uVar4);
LAB_00106fbb:
  if (pFVar13 != (FILE *)0x0) {
    fclose(pFVar13);
  }
  if (local_6b0 != (FILE *)0x0) {
    fclose(local_6b0);
  }
  uVar4 = this->m_iNumNet;
  iVar3 = GetMemory();
  CObject::Display(0,"input [%s with %d nets] is loaded (%.1f MB)\n",
                   SUB84((double)iVar3 * 0.0009765625,0),local_648,(ulong)uVar4);
  if ((this->field_0x834 != '\0') &&
     (pFVar13 = fopen(&this->field_0x834,"rt"), pFVar13 != (FILE *)0x0)) {
    fclose(pFVar13);
    this->field_0xc50 = this->field_0xc50 & 0xfc;
  }
  if (*(int *)&this->field_0xc54 < 0) {
    iVar6 = (int)(this->super_CBBox).m_iMaxX - (int)(this->super_CBBox).m_iMinX;
    iVar3 = (int)(this->super_CBBox).m_iMaxY - (int)(this->super_CBBox).m_iMinY;
    if (iVar3 < iVar6) {
      iVar3 = iVar6;
    }
    *(int *)&this->field_0xc54 = (int)((double)iVar3 * 0.1);
  }
  CObject::Display(2,"mazerouting margin %d\n",(ulong)*(uint *)&this->field_0xc54);
  (*(this->super_CObject)._vptr_CObject[2])(this,stdout,0);
  return 1;
}

Assistant:

int	CDesign::Initialize(char* pName)
{
#ifdef _DEBUG
	m_iDebugNet	=	188;
#endif
	ReadParam(pName);

	//SetState(STATE_DESN_COMPLETED);
	//PrintResult();

	//vector<CGrid*>	Queue;

	//CGrid	G[4];
	//CGrid* pG[4];

	//G[0].SetMazeCostGrid(1,NULL);
	//G[1].SetMazeCostGrid(7,NULL);
	//G[2].SetMazeCostGrid(4,NULL);
	//G[3].SetMazeCostGrid(3,NULL);

	//Queue.push_back(&G[0]);

	//make_heap(Queue.begin(),Queue.end(),CGridOpMaze());

	//Queue.push_back(&G[1]);
	//Queue.push_back(&G[2]);
	//Queue.push_back(&G[3]);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());

	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	//G[1].SetMazeCostGrid(2,NULL);

	//push_heap(Queue.begin(), Queue.end(), CGridOpMaze());


	//pG[0]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[1]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[2]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();
	//pG[3]	=	Queue.front();	pop_heap(Queue.begin(), Queue.end(), CGridOpMaze());Queue.pop_back();

	char	cName[MAX_BUFFER_STR];
	char	cLine[MAX_BUFFER_STR];

	//open log fiile
	SAFE_FCLOSE(m_pLog);
	sprintf(cName,"%s.log",m_Param.m_cInput_File);	
	m_pLog		=	fopen(cName,"wt");
	m_pDesign	=	this;

	Display(DISPLAY_MODE_INFO,"input file [%s]\n",m_Param.m_cInput_File);
	Display(DISPLAY_MODE_INFO,"tree file [%s]\n",m_Param.m_cTree_File);

	FILE*	pInput_File		=	fopen(m_Param.m_cInput_File,"rt");
	FILE*	pTree_File		=	fopen(m_Param.m_cTree_File,"rt");

	if(pTree_File==NULL)
	{
		Display(DISPLAY_MODE_INFO,"tree file will be written as ");

#ifdef WIN32

		// open in write mode [1/31/2007 thyeros]
		pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
		readLUT();
#else
		
		char	cCmd[MAX_BUFFER_STR];

		//if(STRICMP(m_Param.m_cTree_File,"flute")==0 )
		//{
			// open in write mode [1/31/2007 thyeros]
		  	if(strlen(m_Param.m_cTree_File)==0)
			  {
			    sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			  }

			Display(DISPLAY_MODE_NONE,"%s",m_Param.m_cTree_File);


			pTree_File		=	fopen(m_Param.m_cTree_File,"wt");
			readLUT(); // Before use flute you must init it. Need LUT Data files(provided by flute).

			Display(DISPLAY_MODE_INFO,"building steiner tree by *pure flute\n");
			//}

		/*
		else
		{

			if(strlen(m_Param.m_cTree_File)==0)
			{
				sprintf(m_Param.m_cTree_File,"%s.stt",m_Param.m_cInput_File);
			}

			Display(DISPLAY_MODE_NONE,"%s\n",m_Param.m_cTree_File);

			sprintf(cCmd,"./cflute.x -bt %s %s 1.0 > /tmp/stt",m_Param.m_cInput_File,m_Param.m_cTree_File);
			Display(DISPLAY_MODE_EXEC,"%s\n",cCmd);
			Display(DISPLAY_MODE_INFO,"building steiner tree in %s...",m_Param.m_cTree_File);
			Display(DISPLAY_MODE_NONE,"done (%d)!\n",system(cCmd));

			pTree_File		=	fopen(m_Param.m_cTree_File,"rt");
		}
		*/
#endif

	}else{
		IsLUTup=1;
	}

    // Read basic param of input data.
	while (fgets(cLine,sizeof(cLine),pInput_File))
	{
		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		char*	pToken	=	strtok(cLine," \t\n");

		if(STRICMP(pToken,"grid")==0)
		{
			m_iSizeX		=	atoi(strtok(NULL," \t\n"));
			m_iSizeY		=	atoi(strtok(NULL," \t\n"));

			pToken			=	strtok(NULL," \t\n");
			if(pToken)	m_iSizeZ	=	max(2,atoi(pToken));		// multilayer routing [1/31/2007 thyeros]
			else		m_iSizeZ	=	2;							// planar routing [1/31/2007 thyeros]

            ///@sa CBBox::Initialize()
			CBBox::Initialize(0,0,0,m_iSizeX,m_iSizeY,m_iSizeZ);

            ///@sa CreateLayer()
			CreateLayer();
		}
		else if(STRICMP(pToken,"vertical")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);	
                    ///@sa CLayer::Configure()
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_VERTICAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"horizontal")==0&&strtok(NULL," \t\n"))
		{
			int	iIndex	=	LAYER_METAL1;	
			for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"))
			{
				int	iCapacity	=	atoi(pToken);
				if(iCapacity)
				{
					for(;GetLayer(iIndex)->GetKey();iIndex++);
					GetLayer(iIndex)->Configure(iIndex,iCapacity,DIR_HORIZONTAL,0,0,0,this);
				}

				++iIndex;
			}
		}
		else if(STRICMP(pToken,"minimum")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"width")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,atoi(pToken),-1,-1,this);
				}

			}
			else if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,atoi(pToken),-1,this);
				}
			}
		}
		else if(STRICMP(pToken,"via")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"spacing")==0)
			{
				int	iIndex	=	LAYER_METAL1;	
				for(pToken=strtok(NULL," \t\n");pToken;pToken=strtok(NULL," \t\n"),iIndex++)
				{
					GetLayer(iIndex)->Configure(-1,-1,-1,-1,-1,atoi(pToken),this);
				}
			}
		}
		else if(STRICMP(pToken,"num")==0)
		{
			pToken			=	strtok(NULL," \t\n");
			if(STRICMP(pToken,"net")==0)
			{
                ///@sa CreatNet()
				CreateNet(atoi(strtok(NULL," \t\n")));

				for (int i=LAYER_METAL1;i<=T();++i)	
				{
					CLayer*	pLayer	=	GetLayer(i);

					if(!pLayer->GetKey())
					{
						int	iDirection	=	-1;

						if(i==LAYER_METAL1)										iDirection	=	DIR_VERTICAL;
						else if(GetLayer(i-1)->GetDirection()==DIR_VERTICAL)	iDirection	=	DIR_HORIZONTAL;
						else													iDirection	=	DIR_VERTICAL;

						pLayer->Configure(i,0,iDirection,0,0,0,this);
					}

                    ///@sa CLayer::Initialize()
					pLayer->Initialize();
					m_iMaxCapacity		=	MAX(m_iMaxCapacity,pLayer->GetCapacity(GET_MODE_MAX));
				}

				///@sa SetHighestRoutableLayer()
				SetHighestRoutableLayer(T());
				///@sa SetLowestRoutableLayer()
				SetLowestRoutableLayer(LAYER_METAL1);

				break;
			}
		}
		else
		{
			m_iLowX		=	atoi(pToken);
			m_iLowY		=	atoi(strtok(NULL," \t\n"));
			m_iGridX	=	atoi(strtok(NULL," \t\n"));
			m_iGridY	=	atoi(strtok(NULL," \t\n"));
		}
	}

	Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
	Display(DISPLAY_MODE_INFO,"reading nets started (%.1f MB)\n",GetMemory()/1024.0);

	//////////////////////////////////////////////////////////////////////////
	// start read nets [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	int	iNetIndex	=	0;
	for(int i=0;i<m_iNumNet;++i)
	{
		while(fgets(cLine,sizeof(cLine),pInput_File))
		{
			if(cLine[0]=='#')	continue;
			if(strlen(cLine)<2)	continue;
			break;
		}

		char	cNetName[MAX_BUFFER_STR];
		sprintf(cNetName,strtok(cLine," \t\n"));
		int		iNetID	 		=	atoi(strtok(NULL," \t\n"));
		int		iNumPin			=	atoi(strtok(NULL," \t\n"));
		int		iWidth			=	1;

		char*	pToken			=	strtok(NULL," \t\n");
		if(pToken)	iWidth		=	atoi(pToken);	

		m_ppNet[iNetIndex]		=	new	CNet;
		assert(m_ppNet[iNetIndex]);

		CNet*	pNet			=	GetNet(iNetIndex);
        ///@sa CNet
		pNet->Initialize(iNetID,/*iWidth,*/this);

		if(iNumPin>1000)
		{
			Display(DISPLAY_MODE_WARN,"net (%s) with too many pins (%d) will be ignored\n",cNetName,iNumPin);

			for(int j=0;j<iNumPin;++j)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}
			}

			iNumPin	=	0;
		}

		// get pins [1/31/2007 thyeros]
		vector<CPin*>	PinList;
		for(int j=0;j<iNumPin;++j)
		{
			while(fgets(cLine,sizeof(cLine),pInput_File))
			{
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;
				break;
			}

			// this is the real location [1/31/2007 thyeros]
			int	iRX				=	atoi(strtok(cLine," \t\n"));
			int	iRY				=	atoi(strtok(NULL," \t\n"));
			int	iX				=	(iRX-m_iLowX)/m_iGridX;
			int	iY				=	(iRY-m_iLowY)/m_iGridY;
			int	iZ				=	LAYER_METAL1;

			pToken				=	strtok(NULL," \t\n");
			if(pToken)	iZ		=	atoi(pToken);

			CPin*		pPin	=	NULL;

			for(int k=0;k<PinList.size()&&!pPin;k++)
			{
				CPin*	pCurPin	=	PinList[k];

				if(pCurPin->X()==iX&&pCurPin->Y()==iY)	pPin		=	pCurPin;
			}

			if(pPin==NULL)
			{
				pPin	=	new	CPin;
				pPin->Initialize(PinList.size(),iX,iY,iZ,pNet);
				PinList.push_back(pPin);
			}
		}

		pNet->AddPin(&PinList);
//		pNet->m_iMinVia	+=	PinList.size();

		if(IsLUTup)
		{
			if(pNet->GetNumPin()<2)
			{
				if(pTree_File) fprintf(pTree_File,"%s %d %d\n!\n",cNetName,(int)pNet->GetKey(),0);
			}
			else
			{
				// create and save a tree topolgy [1/31/2007 thyeros]
				static int iArrX[MAX_BUFFER];
				static int iArrY[MAX_BUFFER];

				for(int j=0;j<pNet->GetNumPin();++j)
				{
					iArrX[j]	=	pNet->GetPin(j)->X();
					iArrY[j]	=	pNet->GetPin(j)->Y();
				}			

				Tree FluteTree;

				if(pNet->GetNumPin()<=9)	FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY);
				else						FluteTree = flute(pNet->GetNumPin(),iArrX,iArrY,ACCURACY+25);

				int	iNumWire	=	0;
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					++iNumWire;
				}  

				if(pTree_File) fprintf(pTree_File,"%s %d %d\n",cNetName,(int)pNet->GetKey(),iNumWire);
				for(int j=0;j<2*FluteTree.deg-2;++j) 
				{
					int     iNeighbor = FluteTree.branch[j].n;

					if(iNeighbor==j)        continue;
					if(FluteTree.branch[j].x==FluteTree.branch[iNeighbor].x&&FluteTree.branch[j].y==FluteTree.branch[iNeighbor].y)   continue;

					if(pTree_File) fprintf(pTree_File,"%d %d - %d %d\n",  FluteTree.branch[j].x,FluteTree.branch[j].y,FluteTree.branch[iNeighbor].x,FluteTree.branch[iNeighbor].y);

					CWire*	pWire	=	CWire::New();//new	CWire;


					assert(pWire);

					int	iX1			=	FluteTree.branch[j].x;
					int	iY1			=	FluteTree.branch[j].y;
					int	iX2			=	FluteTree.branch[iNeighbor].x;
					int	iY2			=	FluteTree.branch[iNeighbor].y;

					CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
					CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
					int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

					pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
					pNet->AddWire(pWire);
//					pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
				}
				if(pTree_File) fprintf(pTree_File,"!\n");fflush(pTree_File);
			}
		}
		else
		{
			// read the tree toplogy [1/31/2007 thyeros]
			while(fgets(cLine,sizeof(cLine),pTree_File))
			{
				if(cLine[0]=='!')	break;
				if(cLine[0]=='#')	continue;
				if(strlen(cLine)<2)	continue;

				char*	pName			=	strtok(cLine," \t\n");
				int		iNetIndex 		=	atoi(strtok(NULL," \t\n"));
				int		iNumWire		=	atoi(strtok(NULL," \t\n"));

				for(int j=0;j<iNumWire;++j)
				{
					while(fgets(cLine,sizeof(cLine),pTree_File))
					{
						if(cLine[0]=='#')	continue;
						if(strlen(cLine)<2)	continue;
						break;
					}

					// larget nets with over 1000pins have ZERO pins [2/20/2007 thyeros]
					if(pNet->GetNumPin()>=2)
					{
						CWire*	pWire	=	CWire::New();//new	CWire;
						assert(pWire);

						int	iX1			=	atoi(strtok(cLine," \t\n"));
						int	iY1			=	atoi(strtok(NULL," \t\n"));
						strtok(NULL," \t\n");	//thyeros- dash.. [6/16/2006]
						int	iX2			=	atoi(strtok(NULL," \t\n"));
						int	iY2			=	atoi(strtok(NULL," \t\n"));

						CPin*	pPin1	=	pNet->GetPin(iX1,iY1);
						CPin*	pPin2	=	pNet->GetPin(iX2,iY2);
						int	iZ			=	MAX(pPin1? pPin1->Z():GetRoutableLayer(GET_MODE_MIN),pPin2? pPin2->Z():GetRoutableLayer(GET_MODE_MIN));

						pWire->Initialize(iX1,iY1,iX2,iY2,iZ);
						pNet->AddWire(pWire);
//						pNet->m_iMinVia	+=	(2-pWire->GetNumPinOn()+pWire->IsFlat()? 0:1);			
					}
				}				
			}
		}

		if(pNet->IsLocal())
		{
			assert(pNet==m_ppNet[iNetIndex]);

			SAFE_DEL(m_ppNet[iNetIndex]);
			++m_iNumLocalNet;
		}
		else
		{
			if(pNet->GetNumWire()==0)	Display(DISPLAY_MODE_ERRO,"net %s should have at least one wire\n",cNetName);
			pNet->m_iMinWL	=	pNet->GetLength(GET_MODE_STATE,STATE_WIRE_UNROUTED);
			++iNetIndex;
		}
	}

	// save some memory by removing local nets [2/13/2007 thyeros]
	CreateNet(iNetIndex);

	//////////////////////////////////////////////////////////////////////////
	// read speical net/blockages [1/31/2007 thyeros]
	//////////////////////////////////////////////////////////////////////////
	while(fgets(cLine,sizeof(cLine),pInput_File))
	{
		//// temporarily ignore blocakges  [2/27/2007 thyeros]
		//Display(DISPLAY_MODE_WARN,"blockages are ignored for test purpose!\n");
		//break;

		if(cLine[0]=='#')	continue;
		if(strlen(cLine)<2)	continue;

		int	iNumBlock	=	atoi(cLine);

		if(iNumBlock)
		{
			Display(DISPLAY_MODE_INFO,"%d blocakges are specified\n",iNumBlock);

			for(int i=0;i<iNumBlock;++i)
			{
				while(fgets(cLine,sizeof(cLine),pInput_File))
				{
					if(cLine[0]=='#')	continue;
					if(strlen(cLine)<2)	continue;
					break;
				}

				int	iX1		=	atoi(strtok(cLine," \t\n"));
				int	iY1		=	atoi(strtok(NULL," \t\n"));
				int	iZ1		=	atoi(strtok(NULL," \t\n"));

				int	iX2		=	atoi(strtok(NULL," \t\n"));
				int	iY2		=	atoi(strtok(NULL," \t\n"));
				int	iZ2		=	atoi(strtok(NULL," \t\n"));

				assert(iZ1==iZ2);
				assert(iX1==iX2||iY1==iY2);
				assert(abs((iX1-iX2))==1||abs((iY1-iY2))==1);

				CBoundary*	pBoundary	=	GetLayer(iZ1)->GetBoundary(iX1,iY1,iX2,iY2);

				if(!pBoundary)				Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) not found\n",iX1,iY1,iZ1,iX2,iY2,iZ2);
				if(pBoundary->m_iNumOCap)	Display(DISPLAY_MODE_ERRO,"boundary (%d,%d,%d)-(%d,%d,%d) is overwritten\n",iX1,iY1,iZ1,iX2,iY2,iZ2);

				int	iBlockage	=	pBoundary->GetParent()->GetCapacity(GET_MODE_MAX)-atoi(strtok(NULL," \t\n"));
				m_iNumBCap	+=		iBlockage;
				pBoundary->AdjustCapacity(iBlockage);
			}
			Display(DISPLAY_MODE_INFO,"total available capacity: %d\n",GetCapacity(GET_MODE_ACAP));
		}

		break;
	}

	SAFE_FCLOSE(pInput_File);
	SAFE_FCLOSE(pTree_File);

	Display(DISPLAY_MODE_INFO,"input [%s with %d nets] is loaded (%.1f MB)\n",m_Param.m_cInput_File,GetNumNet(),GetMemory()/1024.0);

	if(strlen(m_Param.m_cDump_File))
	{
		FILE*	pDumpFile	=	fopen(m_Param.m_cDump_File,"rt");
		if(pDumpFile)
		{
			SAFE_FCLOSE(pDumpFile);
			m_Param.m_iProperty	&=	~(PROP_PARAM_PRER|PROP_PARAM_BOXR);
		}
	}

	if(m_Param.m_iMazeRouting_Margin<0)	m_Param.m_iMazeRouting_Margin	=	0.1*MAX(W(),H());
	Display(DISPLAY_MODE_PARM,"mazerouting margin %d\n",m_Param.m_iMazeRouting_Margin);

	Print(stdout,PRINT_MODE_TEXT);

	return	TRUE;
}